

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LatencyDecodingSynapse.cpp
# Opt level: O1

void __thiscall LatencyDecodingSynapse::update(LatencyDecodingSynapse *this)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  double *pdVar4;
  Event *pEVar5;
  Population *pPVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  uint uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  double dVar13;
  _func_int **pp_Var14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  dVar1 = this->currentWindow;
  dVar2 = this->param->window_length_s;
  dVar13 = Clock::getCurrentTime(this->clock);
  if (dVar1 + dVar2 <= dVar13) {
    uVar12 = (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_rows;
    if ((long)uVar12 < 0) {
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/CwiseNullaryOp.h"
                    ,0x4a,
                    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                   );
    }
    pdVar3 = (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    if (1 < (long)uVar12) {
      uVar10 = 0;
      do {
        pdVar3[uVar10] = -1.0;
        (pdVar3 + uVar10)[1] = -1.0;
        uVar10 = uVar10 + 2;
      } while (uVar10 < (uVar12 & 0x7ffffffffffffffe));
    }
    auVar8 = _DAT_0010d050;
    auVar7 = _DAT_0010d040;
    if ((long)(uVar12 & 0x7ffffffffffffffe) < (long)uVar12) {
      uVar9 = (uint)uVar12 & 1;
      lVar11 = (ulong)uVar9 - 1;
      auVar15._8_4_ = (int)lVar11;
      auVar15._0_8_ = lVar11;
      auVar15._12_4_ = (int)((ulong)lVar11 >> 0x20);
      uVar10 = 0;
      auVar15 = auVar15 ^ _DAT_0010d050;
      do {
        auVar16._8_4_ = (int)uVar10;
        auVar16._0_8_ = uVar10;
        auVar16._12_4_ = (int)(uVar10 >> 0x20);
        auVar16 = (auVar16 | auVar7) ^ auVar8;
        if ((bool)(~(auVar16._4_4_ == auVar15._4_4_ && auVar15._0_4_ < auVar16._0_4_ ||
                    auVar15._4_4_ < auVar16._4_4_) & 1)) {
          pdVar3[(uVar12 & 0xfffffffffffffffe) + uVar10] = -1.0;
        }
        if ((auVar16._12_4_ != auVar15._12_4_ || auVar16._8_4_ <= auVar15._8_4_) &&
            auVar16._12_4_ <= auVar15._12_4_) {
          pdVar3[(uVar12 & 0xfffffffffffffffe) + uVar10 + 1] = -1.0;
        }
        uVar10 = uVar10 + 2;
      } while ((uVar9 + 1 & 0xfffffffe) != uVar10);
    }
    this->currentWindow = this->param->window_length_s + this->currentWindow;
  }
  if (0 < this->inputSize) {
    uVar12 = 0;
    do {
      if ((this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          m_storage.m_rows <= (long)uVar12) {
        __assert_fail("index >= 0 && index < size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/DenseCoeffsBase.h"
                      ,0x1a9,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                     );
      }
      pdVar4 = (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data;
      pdVar3 = pdVar4 + uVar12;
      if ((*pdVar3 <= 0.0 && *pdVar3 != 0.0) &&
         (pEVar5 = (((this->super_Synapse).from_population)->output).
                   super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar12], pEVar5->type == Spike)) {
        pp_Var14 = (_func_int **)
                   (((pEVar5->eventTime - this->currentWindow) / this->param->window_length_s + -0.1
                    ) * 1.25);
        pdVar4[uVar12] = (double)pp_Var14;
        (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
        super__Vector_impl_data._M_start[uVar12][1]._vptr_Event = pp_Var14;
      }
      pPVar6 = (this->super_Synapse).to_population;
      (*pPVar6->_vptr_Population[5])
                (pPVar6,uVar12 & 0xffffffff,
                 (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar12]);
      Logging::logValue(this->logger,(long)this,(int)uVar12,3,
                        (double)(this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar12][1]._vptr_Event);
      uVar12 = uVar12 + 1;
    } while ((long)uVar12 < (long)this->inputSize);
  }
  return;
}

Assistant:

void LatencyDecodingSynapse::update() {
    if(currentWindow + param->window_length_s <= clock->getCurrentTime()) {
        spikeTimes.setConstant(-1);
        currentWindow += param->window_length_s;
    }
    for(int i = 0; i < inputSize; i++) {
        if(spikeTimes(i) < 0 && from_population->output[i]->type == EventType::Spike) {      
            double s0 = from_population->output[i]->eventTime - currentWindow;
            s0 = s0/param->window_length_s;
            spikeTimes(i) = (s0 - 0.1) * 1.25;
            static_cast<ValueEvent*>(output[i])->setValue(spikeTimes(i));
            
        }
        to_population->setInput(i, output[i]);
        logger->logValue((long)this, i, EventType::Value, static_cast<ValueEvent*>(output[i])->value);
    }
}